

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<std::_V2::error_category_const&>::
captureExpression<(Catch::Internal::Operator)0,std::_V2::error_category>
          (ExpressionLhs<std::_V2::error_category_const&> *this,error_category *rhs)

{
  ResultBuilder *pRVar1;
  allocator<char> local_71;
  string local_70;
  string local_50;
  string local_30;
  
  pRVar1 = ResultBuilder::setResultType
                     (*(ResultBuilder **)this,*(error_category **)(this + 8) == rhs);
  std::__cxx11::string::string((string *)&local_30,(string *)Detail::unprintableString_abi_cxx11_);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_30);
  std::__cxx11::string::string((string *)&local_50,(string *)Detail::unprintableString_abi_cxx11_);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"==",&local_71);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }